

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

Vec_Int_t * Abc_NtkCollectCoCones(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint uVar1;
  void *__ptr;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Int_t *vArr;
  int *piVar5;
  uint *__ptr_00;
  void *pvVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  Vec_Ptr_t *pVVar11;
  timespec ts;
  timespec local_78;
  long local_60;
  Vec_Int_t *local_58;
  int local_4c;
  Vec_Ptr_t *local_48;
  ulong local_40;
  void *local_38;
  
  iVar2 = clock_gettime(3,&local_78);
  if (iVar2 < 0) {
    local_60 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_60 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  piVar5 = (int *)0x0;
  local_4c = fVerbose;
  pVVar4 = Abc_NtkDfs(pNtk,0);
  vArr = (Vec_Int_t *)calloc(1,0x10);
  pVVar11 = pNtk->vCos;
  iVar2 = pVVar11->nSize;
  local_58 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar9 = iVar2;
  }
  local_58->nSize = 0;
  local_58->nCap = iVar9;
  if (iVar9 != 0) {
    piVar5 = (int *)malloc((long)iVar9 << 2);
  }
  local_58->pArray = piVar5;
  uVar1 = pNtk->vObjs->nSize;
  __ptr_00 = (uint *)malloc(0x10);
  uVar3 = 8;
  if (6 < uVar1 - 1) {
    uVar3 = uVar1;
  }
  *__ptr_00 = uVar3;
  local_40 = (ulong)uVar1;
  if (uVar3 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = calloc((long)(int)uVar3,0x10);
  }
  *(void **)(__ptr_00 + 2) = pvVar6;
  __ptr_00[1] = (uint)local_40;
  local_48 = pVVar4;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    local_38 = pvVar6;
    do {
      pvVar6 = local_48->pArray[lVar7];
      iVar2 = *(int *)((long)pvVar6 + 0x10);
      if (((long)iVar2 < 0) || ((int)local_40 <= iVar2)) goto LAB_002ef967;
      pVVar10 = (Vec_Int_t *)((long)iVar2 * 0x10 + (long)local_38);
      if (0 < *(int *)((long)pvVar6 + 0x1c)) {
        lVar8 = 0;
        do {
          iVar2 = *(int *)(*(long *)((long)pvVar6 + 0x20) + lVar8 * 4);
          if (((long)iVar2 < 0) || ((int)__ptr_00[1] <= iVar2)) goto LAB_002ef967;
          Vec_IntTwoMerge2(pVVar10,(Vec_Int_t *)((long)iVar2 * 0x10 + *(long *)(__ptr_00 + 2)),vArr)
          ;
          local_78.tv_sec._0_4_ = pVVar10->nCap;
          local_78.tv_sec._4_4_ = pVVar10->nSize;
          local_78.tv_nsec = (long)pVVar10->pArray;
          iVar2 = vArr->nSize;
          piVar5 = vArr->pArray;
          pVVar10->nCap = vArr->nCap;
          pVVar10->nSize = iVar2;
          pVVar10->pArray = piVar5;
          vArr->nCap = (undefined4)local_78.tv_sec;
          vArr->nSize = local_78.tv_sec._4_4_;
          vArr->pArray = (int *)local_78.tv_nsec;
          lVar8 = lVar8 + 1;
        } while (lVar8 < *(int *)((long)pvVar6 + 0x1c));
      }
      Vec_IntPush(pVVar10,(int)lVar7);
      lVar7 = lVar7 + 1;
    } while (lVar7 < local_48->nSize);
    pVVar11 = pNtk->vCos;
    iVar2 = pVVar11->nSize;
  }
  pVVar10 = local_58;
  if (iVar2 < 1) {
    pvVar6 = *(void **)(__ptr_00 + 2);
  }
  else {
    lVar7 = 0;
    do {
      iVar2 = **(int **)((long)pVVar11->pArray[lVar7] + 0x20);
      if (((long)iVar2 < 0) || ((int)__ptr_00[1] <= iVar2)) {
LAB_002ef967:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pvVar6 = *(void **)(__ptr_00 + 2);
      Vec_IntPush(pVVar10,*(int *)((long)pvVar6 + (long)iVar2 * 0x10 + 4));
      lVar7 = lVar7 + 1;
      pVVar11 = pNtk->vCos;
    } while (lVar7 < pVVar11->nSize);
  }
  uVar1 = *__ptr_00;
  if ((long)(int)uVar1 < 1) {
    if (pvVar6 == (void *)0x0) goto LAB_002ef88d;
  }
  else {
    lVar7 = 0;
    do {
      __ptr = *(void **)((long)pvVar6 + lVar7 + 8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)pvVar6 + lVar7 + 8) = 0;
      }
      lVar7 = lVar7 + 0x10;
    } while ((long)(int)uVar1 * 0x10 != lVar7);
  }
  free(pvVar6);
LAB_002ef88d:
  free(__ptr_00);
  pVVar11 = local_48;
  if (local_48->pArray != (void **)0x0) {
    free(local_48->pArray);
  }
  free(pVVar11);
  iVar2 = local_4c;
  if (vArr->pArray != (int *)0x0) {
    free(vArr->pArray);
  }
  free(vArr);
  if (iVar2 != 0) {
    iVar9 = 3;
    iVar2 = clock_gettime(3,&local_78);
    if (iVar2 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    lVar7 = lVar7 + local_60;
    Abc_Print(iVar9,"%s =","Input  cone computation");
    Abc_Print(iVar9,"%9.2f sec\n",SUB84((double)lVar7 / 1000000.0,0));
  }
  return pVVar10;
}

Assistant:

Vec_Int_t * Abc_NtkCollectCoCones( Abc_Ntk_t * pNtk, int fVerbose )
{
    abctime clk = Abc_Clock();
    Abc_Obj_t * pNode; int i, k;
    Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_Int_t * vFanin, * vFanout, * vTemp = Vec_IntAlloc( 0 );
    Vec_Int_t * vSuppsCo = Vec_IntAlloc( Abc_NtkCoNum(pNtk) );
    Vec_Wec_t * vSupps = Vec_WecStart( Abc_NtkObjNumMax(pNtk) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        vFanout = Vec_WecEntry(vSupps, Abc_ObjId(pNode));
        for ( k = 0; k < Abc_ObjFaninNum(pNode); k++ )
        {
            vFanin = Vec_WecEntry(vSupps, Abc_ObjFaninId(pNode, k));
            Vec_IntTwoMerge2( vFanout, vFanin, vTemp ); 
            ABC_SWAP( Vec_Int_t, *vFanout, *vTemp );
        }
        Vec_IntPush( vFanout, i );
    }
    Abc_NtkForEachCo( pNtk, pNode, i )
        Vec_IntPush( vSuppsCo, Vec_IntSize(Vec_WecEntry(vSupps, Abc_ObjFaninId0(pNode))) );
    Vec_WecFree( vSupps );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTemp );
    if ( fVerbose )
        Abc_PrintTime( 1, "Input  cone computation", Abc_Clock() - clk );
    //Vec_IntPrint( vSuppsCo );
    return vSuppsCo;
}